

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O1

void __thiscall
ASN1Test_StringByCustomNIDThreads_Test::TestBody(ASN1Test_StringByCustomNIDThreads_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  allocator_type *__a;
  ulong uVar2;
  thread *ptVar3;
  allocator_type *paVar4;
  anon_class_8_1_898f4446_for__M_head_impl *__args;
  anon_class_8_1_898f4447_for__M_head_impl *extraout_RDX;
  anon_class_8_1_898f4447_for__M_head_impl *extraout_RDX_00;
  anon_class_8_1_898f4447_for__M_head_impl *__args_00;
  thread *thread;
  ulong __n;
  char *pcVar5;
  ulong uVar6;
  thread *ptVar7;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int nid2;
  int nid1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_50;
  allocator_type *local_48;
  AssertHelper local_40;
  int local_38;
  int local_34;
  
  local_34 = OBJ_create("1.2.840.113554.4.1.72585.1002","custom OID 1002","custom OID 1002");
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_60._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperNE<int,int>
            ((internal *)local_58,"0","nid1",(int *)&local_60,&local_34);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x77c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
  }
  else {
    if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_50,pbStack_50);
    }
    local_38 = OBJ_create("1.2.840.113554.4.1.72585.1003","custom OID 1003","custom OID 1003");
    local_60._M_head_impl = local_60._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperNE<int,int>
              ((internal *)local_58,"0","nid2",(int *)&local_60,&local_38);
    if (local_58[0] != (internal)0x0) {
      if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_50,pbStack_50);
      }
      local_58 = (undefined1  [8])0x0;
      pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_48 = (allocator_type *)0x0;
      local_60._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_34;
      __a = (allocator_type *)
            __gnu_cxx::new_allocator<std::thread>::allocate
                      ((new_allocator<std::thread> *)local_58,1,(void *)0x0);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,ASN1Test_StringByCustomNIDThreads_Test::TestBody()::__0>
                (__a,(thread *)&local_60,__args);
      local_48 = __a + 8;
      pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__a + 8);
      pbVar1 = pbStack_50;
      local_60._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
      local_58 = (undefined1  [8])__a;
      if ((long)pbStack_50 - (long)__a != 0x7ffffffffffffff8) {
        uVar6 = (long)pbStack_50 - (long)__a >> 3;
        uVar2 = uVar6 + (uVar6 == 0);
        __n = uVar2 + uVar6;
        if (0xffffffffffffffe < __n) {
          __n = 0xfffffffffffffff;
        }
        if (CARRY8(uVar2,uVar6)) {
          __n = 0xfffffffffffffff;
        }
        if (__n == 0) {
          ptVar3 = (thread *)0x0;
          __args_00 = extraout_RDX;
        }
        else {
          ptVar3 = __gnu_cxx::new_allocator<std::thread>::allocate
                             ((new_allocator<std::thread> *)local_58,__n,(void *)0x0);
          __args_00 = extraout_RDX_00;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,ASN1Test_StringByCustomNIDThreads_Test::TestBody()::__1>
                  ((allocator_type *)(ptVar3 + uVar6),(thread *)&local_60,__args_00);
        ptVar7 = ptVar3;
        for (paVar4 = __a;
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar4 != pbVar1;
            paVar4 = paVar4 + 8) {
          (ptVar7->_M_id)._M_thread = 0;
          (ptVar7->_M_id)._M_thread = *(native_handle_type *)paVar4;
          *(undefined8 *)paVar4 = 0;
          ptVar7 = ptVar7 + 1;
        }
        if (__a != (allocator_type *)0x0) {
          operator_delete(__a,(long)local_48 - (long)__a);
        }
        local_48 = (allocator_type *)(ptVar3 + __n);
        pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (ptVar7 + 1);
        pbVar1 = pbStack_50;
        local_58 = (undefined1  [8])ptVar3;
        for (; (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ptVar3 != pbVar1
            ; ptVar3 = ptVar3 + 1) {
          std::thread::join();
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_58);
        return;
      }
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    testing::Message::Message((Message *)&local_60);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x77f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if (local_60._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_60._M_head_impl + 8))();
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  return;
}

Assistant:

TEST(ASN1Test, StringByCustomNIDThreads) {
  // This test affects library-global state. We rely on nothing else in the test
  // suite using these OIDs.
  int nid1 = OBJ_create("1.2.840.113554.4.1.72585.1002", "custom OID 1002",
                        "custom OID 1002");
  ASSERT_NE(NID_undef, nid1);
  int nid2 = OBJ_create("1.2.840.113554.4.1.72585.1003", "custom OID 1003",
                        "custom OID 1003");
  ASSERT_NE(NID_undef, nid2);

  std::vector<std::thread> threads;
  threads.emplace_back([&] {
    ASSERT_TRUE(ASN1_STRING_TABLE_add(nid1, 5, 10, V_ASN1_PRINTABLESTRING,
                                      STABLE_NO_MASK));
    bssl::UniquePtr<ASN1_STRING> str(ASN1_STRING_set_by_NID(
        nullptr, reinterpret_cast<const uint8_t *>("12345"), 5, MBSTRING_UTF8,
        nid1));
    ASSERT_TRUE(str);
    EXPECT_EQ(V_ASN1_PRINTABLESTRING, ASN1_STRING_type(str.get()));
    EXPECT_EQ(Bytes("12345"), Bytes(ASN1_STRING_get0_data(str.get()),
                                    ASN1_STRING_length(str.get())));
  });
  threads.emplace_back([&] {
    ASSERT_TRUE(ASN1_STRING_TABLE_add(nid2, 5, 10, V_ASN1_PRINTABLESTRING,
                                      STABLE_NO_MASK));
    bssl::UniquePtr<ASN1_STRING> str(ASN1_STRING_set_by_NID(
        nullptr, reinterpret_cast<const uint8_t *>("12345"), 5, MBSTRING_UTF8,
        nid2));
    ASSERT_TRUE(str);
    EXPECT_EQ(V_ASN1_PRINTABLESTRING, ASN1_STRING_type(str.get()));
    EXPECT_EQ(Bytes("12345"), Bytes(ASN1_STRING_get0_data(str.get()),
                                    ASN1_STRING_length(str.get())));
  });
  for (auto &thread : threads) {
    thread.join();
  }
}